

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_t.cpp
# Opt level: O0

int __thiscall deci::ast_t::Generate(ast_t *this,ostream *output,int pc)

{
  bool bVar1;
  reference ppaVar2;
  ast_item_t *item;
  const_iterator __end1;
  const_iterator __begin1;
  vector<deci::ast_item_t_*,_std::allocator<deci::ast_item_t_*>_> *__range1;
  int pc_local;
  ostream *output_local;
  ast_t *this_local;
  
  __end1 = std::vector<deci::ast_item_t_*,_std::allocator<deci::ast_item_t_*>_>::begin
                     (&this->statements);
  item = (ast_item_t *)
         std::vector<deci::ast_item_t_*,_std::allocator<deci::ast_item_t_*>_>::end
                   (&this->statements);
  __range1._4_4_ = pc;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<deci::ast_item_t_*const_*,_std::vector<deci::ast_item_t_*,_std::allocator<deci::ast_item_t_*>_>_>
                                *)&item);
    if (!bVar1) break;
    ppaVar2 = __gnu_cxx::
              __normal_iterator<deci::ast_item_t_*const_*,_std::vector<deci::ast_item_t_*,_std::allocator<deci::ast_item_t_*>_>_>
              ::operator*(&__end1);
    __range1._4_4_ = (*(*ppaVar2)->_vptr_ast_item_t[2])(*ppaVar2,output,(ulong)__range1._4_4_);
    __gnu_cxx::
    __normal_iterator<deci::ast_item_t_*const_*,_std::vector<deci::ast_item_t_*,_std::allocator<deci::ast_item_t_*>_>_>
    ::operator++(&__end1);
  }
  return __range1._4_4_;
}

Assistant:

int ast_t::Generate(std::ostream& output, int pc) const 
  {
    for (auto item: this->statements) {
      pc = item->Generate(output, pc);
    }
    return pc;
  }